

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O3

sysbvm_tuple_t
sysbvm_interpreter_analyzeAndEvaluateStringWithEnvironment
          (sysbvm_context_t *context,sysbvm_tuple_t environment,sysbvm_tuple_t sourceCodeText,
          sysbvm_tuple_t sourceCodeDirectory,sysbvm_tuple_t sourceCodeName,
          sysbvm_tuple_t sourceCodeLanguage)

{
  sysbvm_tuple_t local_70;
  sysbvm_tuple_t local_68;
  sysbvm_tuple_t sStack_60;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  sysbvm_tuple_t *local_40;
  
  local_40 = &local_70;
  local_68 = 0;
  sStack_60 = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 3;
  local_70 = environment;
  sysbvm_stackFrame_pushRecord(&local_58);
  local_68 = sysbvm_sourceCode_create
                       (context,sourceCodeText,sourceCodeDirectory,sourceCodeName,sourceCodeLanguage
                       );
  sStack_60 = sysbvm_interpreter_analyzeAndEvaluateSourceCodeWithEnvironment
                        (context,local_70,local_68);
  sysbvm_stackFrame_popRecord(&local_58);
  return sStack_60;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_interpreter_analyzeAndEvaluateStringWithEnvironment(sysbvm_context_t *context, sysbvm_tuple_t environment, sysbvm_tuple_t sourceCodeText, sysbvm_tuple_t sourceCodeDirectory, sysbvm_tuple_t sourceCodeName, sysbvm_tuple_t sourceCodeLanguage)
{
    struct {
        sysbvm_tuple_t environment;
        sysbvm_tuple_t astNode;
        sysbvm_tuple_t result;
    } gcFrame = {
        .environment = environment,
    };

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.astNode = sysbvm_sourceCode_create(context, sourceCodeText, sourceCodeDirectory, sourceCodeName, sourceCodeLanguage);
    gcFrame.result = sysbvm_interpreter_analyzeAndEvaluateSourceCodeWithEnvironment(context, gcFrame.environment, gcFrame.astNode);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}